

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

bool __thiscall MlmWrap::blockforreply(MlmWrap *this,string *tracker,uint32_t timeoutms)

{
  int iVar1;
  int iVar2;
  zmsg_t *self;
  char *__s1;
  ostream *poVar3;
  allocator local_69;
  string local_68;
  string local_48;
  
  std::mutex::lock(&this->actormutex);
  zsock_send(this->actor,"ss4","BUR",(tracker->_M_dataplus)._M_p,(ulong)timeoutms);
  self = zactor_recv(this->actor);
  __s1 = zmsg_popstr(self);
  iVar1 = strcmp(__s1,"BURs");
  if (iVar1 != 0) {
    iVar2 = strcmp(__s1,"BURf");
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)&local_68,"Error with blockforreply() when waiting for ",&local_69);
      error(&local_48,this,&local_68);
      poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&local_48);
      poVar3 = std::operator<<(poVar3,(string *)tracker);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->actormutex);
  return iVar1 == 0;
}

Assistant:

bool MlmWrap::blockforreply(std::string tracker, uint32_t timeoutms){
    std::lock_guard<std::mutex> lock(actormutex);
    zsock_send(actor, "ss4", blockuntilrep, tracker.c_str(), timeoutms);
    zmsg_t *msg = zactor_recv(actor);
    char *status = zmsg_popstr(msg);
    bool success = false;
    if(streq(status, blockrepsuccess)){
        success = true;
    }
    else if(streq(status, blockrepfailure)){
        success = false;
    }
    else{
        std::cerr << error("Error with blockforreply() when waiting for ") << tracker << "\n";
    }
    return success;
}